

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_add_srv_req(raft_server *this,req_msg *req)

{
  int *__args_3;
  log_entry *this_00;
  long *plVar1;
  _func_int **pp_Var2;
  bool bVar3;
  bool bVar4;
  buffer *buf;
  iterator iVar5;
  char *__s;
  _func_int *p_Var6;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  int32 *this_01;
  ptr<resp_msg> pVar8;
  ptr<srv_config> srv_conf;
  shared_lock<std::shared_timed_mutex> rlock;
  allocator<char> local_139;
  undefined1 local_138 [16];
  __shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2> local_128 [2];
  shared_lock<std::shared_timed_mutex> local_108;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  char *local_30;
  
  local_f8._M_unused._M_object =
       ((req[3].log_entries_.
         super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->
       super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_128[0]._M_ptr._0_4_ = 7;
  __args_3 = (int *)((long)&(req->super_msg_base).term_ + 4);
  std::make_shared<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int&>
            ((unsigned_long *)this,(msg_type *)local_f8._M_pod_data,(int *)(local_138 + 0x10),
             __args_3);
  if ((*(long *)(in_RDX + 0x40) - (long)*(undefined8 **)(in_RDX + 0x38) == 0x10) &&
     (this_00 = (log_entry *)**(undefined8 **)(in_RDX + 0x38),
     this_00->value_type_ == cluster_server)) {
    if (*(int *)&req[3].log_entries_.
                 super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 3) {
      buf = log_entry::get_buf(this_00);
      srv_config::deserialize((srv_config *)local_138,buf);
      local_108._M_pm = (mutex_type *)&req[2].super_msg_base.dst_;
      local_108._M_owns = true;
      std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)local_108._M_pm);
      local_f8._0_4_ = *(int32 *)local_138._0_8_;
      iVar5 = std::
              _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)&req[1].commit_idx_,(key_type_conflict *)local_f8._M_pod_data);
      if ((iVar5.
           super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
           ._M_cur == (__node_type *)0x0) && (*__args_3 != *(int32 *)local_138._0_8_)) {
        bVar4 = false;
        bVar3 = true;
      }
      else {
        plVar1 = (long *)req[4].last_log_term_;
        local_30 = "the server to be added has a duplicated id with existing server %d";
        __s = strfmt<200>::fmt<int>((strfmt<200> *)&local_f8,*(int32 *)local_138._0_8_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_138 + 0x10),__s,&local_139);
        (**(code **)(*plVar1 + 0x20))(plVar1,local_138 + 0x10);
        std::__cxx11::string::~string((string *)(local_138 + 0x10));
        bVar4 = true;
        bVar3 = false;
      }
      std::shared_lock<std::shared_timed_mutex>::~shared_lock(&local_108);
      if (bVar3) {
        if (*(char *)((long)&req->last_log_idx_ + 1) == '\x01') {
          plVar1 = (long *)req[4].last_log_term_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_f8._M_pod_data,"previous config has not committed yet",
                     (allocator<char> *)(local_138 + 0x10));
          (**(code **)(*plVar1 + 0x18))(plVar1,&local_f8);
          std::__cxx11::string::~string((string *)local_f8._M_pod_data);
        }
        else {
          std::__shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
                     &req[5].last_log_term_,
                     (__shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2> *)local_138)
          ;
          local_f8._8_8_ = 0;
          local_e0 = std::
                     _Function_handler<void_(cornerstone::peer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server_req_handlers.cxx:507:40)>
                     ::_M_invoke;
          local_e8 = std::
                     _Function_handler<void_(cornerstone::peer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server_req_handlers.cxx:507:40)>
                     ::_M_manager;
          local_f8._M_unused._M_object = req;
          std::
          make_shared<cornerstone::peer,std::shared_ptr<cornerstone::srv_config>&,cornerstone::context&,std::function<void(cornerstone::peer&)>&>
                    ((shared_ptr<cornerstone::srv_config> *)(local_138 + 0x10),
                     (context *)&req[5].last_log_term_,
                     (function<void_(cornerstone::peer_&)> *)
                     (req->log_entries_).
                     super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          std::__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2> *)
                     &req[5].super_msg_base.type_,
                     (__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2> *)
                     (local_138 + 0x10));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_128[0]._M_refcount);
          invite_srv_to_join_cluster((raft_server *)req);
          pp_Var2 = this->_vptr_raft_server;
          p_Var6 = (_func_int *)(**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
          pp_Var2[4] = p_Var6;
          *(undefined1 *)(pp_Var2 + 5) = 1;
          std::_Function_base::~_Function_base((_Function_base *)&local_f8);
        }
        this_01 = (int32 *)(local_138 + 8);
      }
      else {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
        _Var7._M_pi = extraout_RDX_00;
        if (bVar4) goto LAB_0014529f;
        this_01 = &this->leader_;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
      _Var7._M_pi = extraout_RDX_01;
      goto LAB_0014529f;
    }
    plVar1 = (long *)req[4].last_log_term_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8._M_pod_data,"this is not a leader, cannot handle AddServerRequest"
               ,(allocator<char> *)(local_138 + 0x10));
    (**(code **)(*plVar1 + 0x18))(plVar1,&local_f8);
  }
  else {
    plVar1 = (long *)req[4].last_log_term_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8._M_pod_data,
               "bad add server request as we are expecting one log entry with value type of ClusterServer"
               ,(allocator<char> *)(local_138 + 0x10));
    (**(code **)(*plVar1 + 0x10))(plVar1,&local_f8);
  }
  std::__cxx11::string::~string((string *)local_f8._M_pod_data);
  _Var7._M_pi = extraout_RDX;
LAB_0014529f:
  pVar8.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  pVar8.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar8.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_add_srv_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries(req.log_entries());
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::add_server_response, id_, leader_));
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::cluster_server)
    {
        l_->debug("bad add server request as we are expecting one log entry with value type of ClusterServer");
        return resp;
    }

    if (role_ != srv_role::leader)
    {
        l_->info("this is not a leader, cannot handle AddServerRequest");
        return resp;
    }

    ptr<srv_config> srv_conf(srv_config::deserialize(entries[0]->get_buf()));
    {
        read_lock(peers_lock_);
        if (peers_.find(srv_conf->get_id()) != peers_.end() || id_ == srv_conf->get_id())
        {
            l_->warn(
                lstrfmt("the server to be added has a duplicated id with existing server %d").fmt(srv_conf->get_id()));
            return resp;
        }
    }

    if (config_changing_)
    {
        // the previous config has not committed yet
        l_->info("previous config has not committed yet");
        return resp;
    }

    conf_to_add_ = std::move(srv_conf);
    timer_task<peer&>::executor exec = [this](peer& p) { this->handle_hb_timeout(p); };
    srv_to_join_ = cs_new<peer>(conf_to_add_, *ctx_, exec);
    invite_srv_to_join_cluster();
    resp->accept(log_store_->next_slot());
    return resp;
}